

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extent_inlines.h
# Opt level: O0

int extent_esnead_comp(extent_t *a,extent_t *b)

{
  extent_t *in_RSI;
  extent_t *in_RDI;
  int ret;
  undefined4 local_4;
  
  local_4 = extent_esn_comp(in_RDI,in_RSI);
  if (local_4 == 0) {
    local_4 = extent_ead_comp(in_RDI,in_RSI);
  }
  return local_4;
}

Assistant:

static inline int
extent_esnead_comp(const extent_t *a, const extent_t *b) {
	int ret;

	ret = extent_esn_comp(a, b);
	if (ret != 0) {
		return ret;
	}

	ret = extent_ead_comp(a, b);
	return ret;
}